

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O1

void __thiscall despot::BaseRockSample::BaseRockSample(BaseRockSample *this,int size,int rocks)

{
  *(code **)this = despot::TrivialParticleUpperBound::TrivialParticleUpperBound;
  *(undefined8 *)&this->field_0x8 = 0;
  *(undefined8 *)&this->field_0x10 = 0;
  *(undefined8 *)&this->field_0x18 = 0;
  *(undefined8 *)&this->field_0x20 = 0;
  *(undefined8 *)&this->field_0x28 = 0;
  *(undefined8 *)&this->field_0x30 = 0;
  despot::BeliefMDP::BeliefMDP(&this->super_BeliefMDP);
  *(undefined ***)this = &PTR__BaseRockSample_0011a410;
  *(undefined ***)&this->super_BeliefMDP = &PTR__BaseRockSample_0011a528;
  *(undefined ***)&this->super_StateIndexer = &PTR__BaseRockSample_0011a630;
  *(undefined ***)&this->super_StatePolicy = &PTR__BaseRockSample_0011a668;
  Grid<int>::Grid(&this->grid_,size,size);
  (this->rock_pos_).super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rock_pos_).super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->rock_pos_).super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->size_ = size;
  this->num_rocks_ = rocks;
  despot::Coord::Coord(&this->start_pos_);
  (this->memory_pool_).freelist_.
  super__Vector_base<despot::RockSampleState_*,_std::allocator<despot::RockSampleState_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->memory_pool_).freelist_.
  super__Vector_base<despot::RockSampleState_*,_std::allocator<despot::RockSampleState_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->memory_pool_).chunks_.
  super__Vector_base<despot::MemoryPool<despot::RockSampleState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::RockSampleState>::Chunk_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->memory_pool_).freelist_.
  super__Vector_base<despot::RockSampleState_*,_std::allocator<despot::RockSampleState_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->memory_pool_).chunks_.
  super__Vector_base<despot::MemoryPool<despot::RockSampleState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::RockSampleState>::Chunk_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->memory_pool_).chunks_.
  super__Vector_base<despot::MemoryPool<despot::RockSampleState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::RockSampleState>::Chunk_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->memory_pool_).num_allocated_ = 0;
  (this->states_).
  super__Vector_base<despot::RockSampleState_*,_std::allocator<despot::RockSampleState_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->states_).
  super__Vector_base<despot::RockSampleState_*,_std::allocator<despot::RockSampleState_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->states_).
  super__Vector_base<despot::RockSampleState_*,_std::allocator<despot::RockSampleState_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->transition_probabilities_).
  super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->transition_probabilities_).
  super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->transition_probabilities_).
  super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->alpha_vectors_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->alpha_vectors_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->alpha_vectors_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mdp_policy_).
  super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mdp_policy_).
  super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mdp_policy_).
  super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (rocks == 4 && size == 4) {
    Init_4_4(this);
  }
  else if (rocks == 5 && (size ^ 5U) == 0) {
    Init_5_5(this);
  }
  else if ((size ^ 5U) == 0 && rocks == 7) {
    Init_5_7(this);
  }
  else if (rocks == 8 && size == 7) {
    Init_7_8(this);
  }
  else if (rocks == 0xb && size == 0xb) {
    Init_11_11(this);
  }
  else {
    InitGeneral(this);
  }
  return;
}

Assistant:

BaseRockSample::BaseRockSample(int size, int rocks) :
	grid_(size, size),
	size_(size),
	num_rocks_(rocks) {
	if (size == 4 && rocks == 4) {
		Init_4_4();
	} else if (size == 5 && rocks == 5) {
		Init_5_5();
	} else if (size == 5 && rocks == 7) {
		Init_5_7();
	} else if (size == 7 && rocks == 8) {
		Init_7_8();
	} else if (size == 11 && rocks == 11) {
		Init_11_11();
	} else {
		InitGeneral();
	}

	// InitStates();
}